

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O1

Type * __thiscall soul::Type::createArray(Type *__return_storage_ptr__,Type *this,ArraySize size)

{
  Category CVar1;
  Structure *o;
  Structure *o_00;
  
  CVar1 = this->category;
  if ((((CVar1 != invalid) && (CVar1 != array)) && (this->isRef == false)) &&
     ((this->isConstant == false && ((this->primitiveType).type != void_)))) {
    __return_storage_ptr__->category = array;
    *(undefined8 *)&__return_storage_ptr__->arrayElementCategory = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->boundingSize + 1) = 0;
    (__return_storage_ptr__->structure).object = (Structure *)0x0;
    __return_storage_ptr__->boundingSize = (BoundedIntSize)size;
    __return_storage_ptr__->arrayElementCategory = CVar1;
    (__return_storage_ptr__->primitiveType).type = (this->primitiveType).type;
    if (CVar1 - 2 < 4) {
      __return_storage_ptr__->arrayElementBoundingSize = this->boundingSize;
    }
    else if (CVar1 == structure) {
      o_00 = getStructRef(this);
      (o_00->super_RefCountedObject).refCount = (o_00->super_RefCountedObject).refCount + 1;
      o = (__return_storage_ptr__->structure).object;
      if (o_00 != o) {
        (__return_storage_ptr__->structure).object = o_00;
        RefCountedPtr<soul::Structure>::decIfNotNull(o);
        o_00 = (Structure *)0x0;
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(o_00);
    }
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("canBeArrayElementType()","createArray",0x108);
}

Assistant:

bool Type::isValid() const                { return category != Category::invalid; }